

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::readFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  pointer *ppcVar1;
  ulong uVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<char,_std::allocator<char>_> readBuffer;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  allocator_type local_69;
  vector<char,_std::allocator<char>_> local_68;
  long *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  ulong local_38;
  
  requireDStackDepth(this,3,"READ-FILE");
  this_00 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ppcVar1 = &local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"READ-FILE","");
  GetFileHandle((Forth *)&local_48,(Cell)this,(string *)(ulong)uVar4,(errorCodes)&local_68);
  if ((pointer *)
      local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  uVar5 = ForthStack<unsigned_int>::getTop(this_00,1);
  std::vector<char,_std::allocator<char>_>::vector(&local_68,(ulong)uVar4,&local_69);
  std::ios::clear((int)local_48 + (int)*(undefined8 *)(*local_48 + -0x18));
  std::istream::read((char *)local_48,
                     (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  pcVar3 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = local_48[1];
  uVar7 = uVar2;
  if ((uVar2 & 0xffffffff) != 0) {
    uVar6 = 0;
    local_38 = uVar2;
    do {
      dataSpaceSet(this,(int)uVar6 + uVar5,*(Char *)((long)pcVar3 + uVar6));
      uVar6 = uVar6 + 1;
      uVar7 = local_38;
    } while ((uVar2 & 0xffffffff) != uVar6);
  }
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)((long)local_48 + *(long *)(*local_48 + -0x18) + 0x20) & 1) &
                     0xffffffba);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)uVar7);
  if ((pointer *)
      local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

void readFile() {
	REQUIRE_DSTACK_DEPTH(3, "READ-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "READ-FILE", errorReadFile);
	auto length = SIZE_T(dStack.getTop());
	auto caddr = (dStack.getTop(1));
	std::vector<char> readBuffer(length);
	f->clear();
	f->read(&readBuffer[0], static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
	auto realLengthF = CELL(f->gcount());
	moveIntoDataSpace(caddr, &readBuffer[0], realLengthF);
	dStack.setTop(f->bad() ? Cell(errorReadFile) : 0);
	dStack.setTop(1, realLengthF);
}